

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O2

void __thiscall luna::GC::CheckGC(GC *this)

{
  char cVar1;
  ostream *poVar2;
  char *pcVar3;
  
  if ((this->gen0_).threshold_count_ <= (this->gen0_).count_) {
    clock();
    if ((this->gen1_).count_ < (this->gen1_).threshold_count_) {
      MinorGC(this);
      pcVar3 = "minor";
    }
    else {
      MajorGC(this);
      pcVar3 = "major";
    }
    clock();
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      poVar2 = std::operator<<((ostream *)&this->log_stream_,pcVar3);
      poVar2 = std::operator<<(poVar2,"[");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," microseconds]: ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," | ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," | ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," - ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," | ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," | ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::endl<char,std::char_traits<char>>(poVar2);
      return;
    }
  }
  return;
}

Assistant:

void GC::CheckGC()
    {
        if (gen0_.count_ >= gen0_.threshold_count_)
        {
            unsigned int gen0_count = gen0_.count_;
            unsigned int gen0_threshold = gen0_.threshold_count_;
            unsigned int gen1_count = gen1_.count_;
            unsigned int gen1_threshold = gen1_.threshold_count_;
            unsigned int gen2_count = gen2_.count_;
            unsigned int gen2_threshold = gen2_.threshold_count_;

            const char *gc_name = "";
            clock_t start = clock();
            if (gen1_.count_ >= gen1_.threshold_count_)
            {
                gc_name = "major";
                MajorGC();
            }
            else
            {
                gc_name = "minor";
                MinorGC();
            }

            clock_t duration = clock() - start;
            unsigned int microseconds = duration * 1000000 / CLOCKS_PER_SEC;
            GC_LOG(gc_name << "[" << microseconds << " microseconds]: " <<
                   gen0_count << " " << gen0_threshold << " | " <<
                   gen1_count << " " << gen1_threshold << " | " <<
                   gen2_count << " " << gen2_threshold << " - " <<
                   gen0_.count_ << " " << gen0_.threshold_count_ << " | " <<
                   gen1_.count_ << " " << gen1_.threshold_count_ << " | " <<
                   gen2_.count_ << " " << gen2_.threshold_count_);
        }
    }